

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O2

uint32_t FAudio_Initialize(FAudio *audio,uint32_t Flags,FAudioProcessor XAudio2Processor)

{
  float *pfVar1;
  
  audio->initFlags = Flags;
  pfVar1 = (float *)(*audio->pMalloc)(4);
  audio->decodeCache = pfVar1;
  pfVar1 = (float *)(*audio->pMalloc)(4);
  audio->resampleCache = pfVar1;
  audio->decodeSamples = 1;
  audio->resampleSamples = 1;
  audio->active = '\x01';
  return 0;
}

Assistant:

uint32_t FAudio_Initialize(
	FAudio *audio,
	uint32_t Flags,
	FAudioProcessor XAudio2Processor
) {
	LOG_API_ENTER(audio)
	FAudio_assert(Flags == 0 || Flags == FAUDIO_DEBUG_ENGINE);
	FAudio_assert(XAudio2Processor == FAUDIO_DEFAULT_PROCESSOR);

	audio->initFlags = Flags;

	/* FIXME: This is lazy... */
	audio->decodeCache = (float*) audio->pMalloc(sizeof(float));
	audio->resampleCache = (float*) audio->pMalloc(sizeof(float));
	audio->decodeSamples = 1;
	audio->resampleSamples = 1;

	FAudio_StartEngine(audio);
	LOG_API_EXIT(audio)
	return 0;
}